

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_>::erase
          (Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *this,Bucket bucket)

{
  byte bVar1;
  Span<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *pSVar2;
  size_t to;
  Span<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *this_00;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  Span<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *pSVar6;
  Span<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *pSVar7;
  Span<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *fromSpan;
  size_t fromIndex;
  
  to = bucket.index;
  this_00 = bucket.span;
  bVar1 = this_00->offsets[to];
  this_00->offsets[to] = 0xff;
  this_00->entries[bVar1].storage.data[0] = this_00->nextFree;
  this_00->nextFree = bVar1;
  this->size = this->size - 1;
LAB_005f4f4d:
  pSVar2 = this->spans;
  uVar3 = this->numBuckets >> 7;
  fromSpan = this_00;
  fromIndex = to;
  do {
    do {
      fromIndex = fromIndex + 1;
      if (fromIndex == 0x80) {
        fromSpan = fromSpan + 1;
        if (((long)fromSpan - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - uVar3 == 0) {
          fromSpan = pSVar2;
        }
        fromIndex = 0;
      }
      if ((ulong)fromSpan->offsets[fromIndex] == 0xff) {
        return;
      }
      uVar5 = *(ulong *)fromSpan->entries[fromSpan->offsets[fromIndex]].storage.data;
      uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
      uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
      uVar5 = (uVar5 >> 0x20 ^ this->seed ^ uVar5) & this->numBuckets - 1;
      pSVar6 = pSVar2 + (uVar5 >> 7);
      sVar4 = (size_t)((uint)uVar5 & 0x7f);
    } while (sVar4 == fromIndex && pSVar6 == fromSpan);
    do {
      if ((pSVar6 == this_00) && (sVar4 == to)) {
        if (fromSpan == this_00) {
          this_00->offsets[to] = this_00->offsets[fromIndex];
          this_00->offsets[fromIndex] = 0xff;
          to = fromIndex;
          this_00 = fromSpan;
        }
        else {
          Span<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_>::moveFromSpan
                    (this_00,fromSpan,fromIndex,to);
          to = fromIndex;
          this_00 = fromSpan;
        }
        goto LAB_005f4f4d;
      }
      sVar4 = sVar4 + 1;
      if (sVar4 == 0x80) {
        pSVar7 = pSVar6 + 1;
        pSVar6 = pSVar2;
        if (((long)pSVar7 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - uVar3 != 0) {
          pSVar6 = pSVar7;
        }
        sVar4 = 0;
      }
    } while ((pSVar6 != fromSpan) || (sVar4 != fromIndex));
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }